

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_fgets(char *buffer,int buflen,FILE *f)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  int n;
  char *p;
  FILE *f_local;
  int buflen_local;
  char *buffer_local;
  
  *buffer = '\0';
  __s = fgets(buffer,buflen,(FILE *)f);
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    iVar1 = (int)sVar2 + -1;
    if ((-1 < iVar1) && (__s[iVar1] == '\n')) {
      __s[iVar1] = '\0';
    }
  }
  return __s;
}

Assistant:

char * stb_fgets(char *buffer, int buflen, FILE *f)
{
   char *p;
   buffer[0] = 0;
   p = fgets(buffer, buflen, f);
   if (p) {
      int n = strlen(p)-1;
      if (n >= 0)
         if (p[n] == '\n')
            p[n] = 0;
   }
   return p;
}